

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amount_tests.cpp
# Opt level: O0

void __thiscall amount_tests::MoneyRangeTest::test_method(MoneyRangeTest *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  char *in_stack_fffffffffffffcc8;
  lazy_ostream *in_stack_fffffffffffffcd0;
  basic_cstring<const_char> *in_stack_fffffffffffffcd8;
  undefined7 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf7;
  size_t in_stack_fffffffffffffcf8;
  size_t line_num;
  const_string *in_stack_fffffffffffffd00;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffffd08;
  unit_test_log_t *this_00;
  lazy_ostream local_1f9;
  undefined1 local_1e9;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [32];
  unit_test_log_t local_1b8 [2];
  const_string local_1a8;
  lazy_ostream local_192;
  undefined1 local_180 [71];
  lazy_ostream local_139;
  undefined1 local_129;
  undefined1 local_128 [16];
  undefined1 local_118 [71];
  lazy_ostream local_d1;
  undefined1 local_c1;
  undefined1 local_c0 [16];
  undefined1 local_b0 [71];
  lazy_ostream local_69;
  undefined1 local_59;
  undefined1 local_58 [16];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffcd8,(pointer)in_stack_fffffffffffffcd0,
               (unsigned_long)in_stack_fffffffffffffcc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               (const_string *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffcd0,(char (*) [1])in_stack_fffffffffffffcc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffcd8,(pointer)in_stack_fffffffffffffcd0,
               (unsigned_long)in_stack_fffffffffffffcc8);
    local_69._1_8_ = 0xffffffffffffffff;
    local_59 = MoneyRange((CAmount *)in_stack_fffffffffffffcc8);
    local_69._vptr_lazy_ostream._0_1_ = 0;
    in_stack_fffffffffffffcd8 = (basic_cstring<const_char> *)0x1e5e060;
    in_stack_fffffffffffffcd0 = &local_69;
    in_stack_fffffffffffffcc8 = "MoneyRange(CAmount(-1))";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_48,local_58,0x10,1,2,&local_59);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffcc8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffcd8,(pointer)in_stack_fffffffffffffcd0,
               (unsigned_long)in_stack_fffffffffffffcc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               (const_string *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffcd0,(char (*) [1])in_stack_fffffffffffffcc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffcd8,(pointer)in_stack_fffffffffffffcd0,
               (unsigned_long)in_stack_fffffffffffffcc8);
    local_d1._1_8_ = 0;
    local_c1 = MoneyRange((CAmount *)in_stack_fffffffffffffcc8);
    local_d1._vptr_lazy_ostream._0_1_ = 1;
    in_stack_fffffffffffffcd8 = (basic_cstring<const_char> *)0x1e7be87;
    in_stack_fffffffffffffcd0 = &local_d1;
    in_stack_fffffffffffffcc8 = "MoneyRange(CAmount(0))";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_b0,local_c0,0x11,1,2,&local_c1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffcc8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffcd8,(pointer)in_stack_fffffffffffffcd0,
               (unsigned_long)in_stack_fffffffffffffcc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               (const_string *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffcd0,(char (*) [1])in_stack_fffffffffffffcc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffcd8,(pointer)in_stack_fffffffffffffcd0,
               (unsigned_long)in_stack_fffffffffffffcc8);
    local_139._1_8_ = 1;
    local_129 = MoneyRange((CAmount *)in_stack_fffffffffffffcc8);
    local_139._vptr_lazy_ostream._0_1_ = 1;
    in_stack_fffffffffffffcd8 = (basic_cstring<const_char> *)0x1e7be87;
    in_stack_fffffffffffffcd0 = &local_139;
    in_stack_fffffffffffffcc8 = "MoneyRange(CAmount(1))";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_118,local_128,0x12,1,2,&local_129);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffcc8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffcd8,(pointer)in_stack_fffffffffffffcd0,
               (unsigned_long)in_stack_fffffffffffffcc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               (const_string *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffcd0,(char (*) [1])in_stack_fffffffffffffcc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffcd8,(pointer)in_stack_fffffffffffffcd0,
               (unsigned_long)in_stack_fffffffffffffcc8);
    local_192._vptr_lazy_ostream._1_1_ = MoneyRange((CAmount *)in_stack_fffffffffffffcc8);
    local_192._vptr_lazy_ostream._0_1_ = 1;
    in_stack_fffffffffffffcd8 = (basic_cstring<const_char> *)0x1e7be87;
    in_stack_fffffffffffffcd0 = &local_192;
    in_stack_fffffffffffffcc8 = "MoneyRange(MAX_MONEY)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_180,(undefined1 *)((long)&local_192._vptr_lazy_ostream + 2),0x13,1,2,
               (undefined1 *)((long)&local_192._vptr_lazy_ostream + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffcc8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    file = &local_1a8;
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffcd8,(pointer)in_stack_fffffffffffffcd0,
               (unsigned_long)in_stack_fffffffffffffcc8);
    this_00 = local_1b8;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,file,line_num,
               (const_string *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffcd0,(char (*) [1])in_stack_fffffffffffffcc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffcd8,(pointer)in_stack_fffffffffffffcd0,
               (unsigned_long)in_stack_fffffffffffffcc8);
    local_1f9._1_8_ = 0x775f05a074001;
    in_stack_fffffffffffffcf7 = MoneyRange((CAmount *)in_stack_fffffffffffffcc8);
    local_1f9._vptr_lazy_ostream._0_1_ = 0;
    in_stack_fffffffffffffcd8 = (basic_cstring<const_char> *)0x1e5e060;
    in_stack_fffffffffffffcd0 = &local_1f9;
    in_stack_fffffffffffffcc8 = "MoneyRange(MAX_MONEY + CAmount(1))";
    local_1e9 = in_stack_fffffffffffffcf7;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_1d8,local_1e8,0x14,1,2,&local_1e9);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffcc8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(MoneyRangeTest)
{
    BOOST_CHECK_EQUAL(MoneyRange(CAmount(-1)), false);
    BOOST_CHECK_EQUAL(MoneyRange(CAmount(0)), true);
    BOOST_CHECK_EQUAL(MoneyRange(CAmount(1)), true);
    BOOST_CHECK_EQUAL(MoneyRange(MAX_MONEY), true);
    BOOST_CHECK_EQUAL(MoneyRange(MAX_MONEY + CAmount(1)), false);
}